

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndWasAssigned::Run
               (void)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  FlagSaver fs;
  CommandLineFlagInfo info;
  CommandLineFlagInfo local_100;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineFlagInfoOrDieTest",
          "FlagExistsAndWasAssigned");
  info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
  info.name._M_string_length = 0;
  info.name.field_2._M_local_buf[0] = '\0';
  info.type._M_dataplus._M_p = (pointer)&info.type.field_2;
  info.type._M_string_length = 0;
  info.type.field_2._M_local_buf[0] = '\0';
  info.description._M_dataplus._M_p = (pointer)&info.description.field_2;
  info.description._M_string_length = 0;
  info.description.field_2._M_local_buf[0] = '\0';
  info.current_value._M_dataplus._M_p = (pointer)&info.current_value.field_2;
  info.current_value._M_string_length = 0;
  info.current_value.field_2._M_local_buf[0] = '\0';
  info.default_value._M_dataplus._M_p = (pointer)&info.default_value.field_2;
  info.default_value._M_string_length = 0;
  fLI::FLAGS_test_int32 = 400;
  info.default_value.field_2._M_local_buf[0] = '\0';
  info.filename._M_dataplus._M_p = (pointer)&info.filename.field_2;
  info.filename._M_string_length = 0;
  info.filename.field_2._M_local_buf[0] = '\0';
  GetCommandLineFlagInfoOrDie(&local_100,"test_int32");
  CommandLineFlagInfo::operator=(&info,&local_100);
  CommandLineFlagInfo::~CommandLineFlagInfo(&local_100);
  bVar1 = std::operator==("test_int32",&info.name);
  if (bVar1) {
    bVar1 = std::operator==("int32",&info.type);
    if (bVar1) {
      bVar1 = std::operator==("",&info.description);
      if (bVar1) {
        bVar1 = std::operator==("400",&info.current_value);
        if (bVar1) {
          bVar1 = std::operator==("-1",&info.default_value);
          if (bVar1) {
            if (info.is_default == true) {
LAB_001384df:
              pcVar2 = "!(info.is_default)";
            }
            else {
              if ((undefined4 *)info.flag_ptr != &fLI::FLAGS_test_int32) {
                pcVar2 = "&FLAGS_test_int32";
LAB_00138528:
                pcVar3 = "info.flag_ptr";
                goto LAB_00138536;
              }
              fLB::FLAGS_test_bool = 1;
              GetCommandLineFlagInfoOrDie(&local_100,"test_bool");
              CommandLineFlagInfo::operator=(&info,&local_100);
              CommandLineFlagInfo::~CommandLineFlagInfo(&local_100);
              bVar1 = std::operator==("test_bool",&info.name);
              if (!bVar1) {
                pcVar2 = "\"test_bool\"";
                goto LAB_00138419;
              }
              bVar1 = std::operator==("bool",&info.type);
              if (!bVar1) {
                pcVar2 = "\"bool\"";
                goto LAB_00138444;
              }
              bVar1 = std::operator==("tests bool-ness",&info.description);
              if (!bVar1) {
                pcVar2 = "\"tests bool-ness\"";
                goto LAB_0013846f;
              }
              bVar1 = std::operator==("true",&info.current_value);
              if (!bVar1) {
                pcVar2 = "\"true\"";
                goto LAB_0013849a;
              }
              bVar1 = std::operator==("false",&info.default_value);
              if (!bVar1) {
                pcVar2 = "\"false\"";
                goto LAB_001384c5;
              }
              if (info.is_default == true) goto LAB_001384df;
              if (info.has_validator_fn != true) {
                if ((undefined1 *)info.flag_ptr == &fLB::FLAGS_test_bool) {
                  CommandLineFlagInfo::~CommandLineFlagInfo(&info);
                  FlagSaver::~FlagSaver(&fs);
                  return;
                }
                pcVar2 = "&FLAGS_test_bool";
                goto LAB_00138528;
              }
              pcVar2 = "!(info.has_validator_fn)";
            }
            fprintf(_stderr,"Check failed: %s\n",pcVar2);
            goto LAB_0013853d;
          }
          pcVar2 = "\"-1\"";
LAB_001384c5:
          pcVar3 = "info.default_value";
        }
        else {
          pcVar2 = "\"400\"";
LAB_0013849a:
          pcVar3 = "info.current_value";
        }
      }
      else {
        pcVar2 = "\"\"";
LAB_0013846f:
        pcVar3 = "info.description";
      }
    }
    else {
      pcVar2 = "\"int32\"";
LAB_00138444:
      pcVar3 = "info.type";
    }
  }
  else {
    pcVar2 = "\"test_int32\"";
LAB_00138419:
    pcVar3 = "info.name";
  }
LAB_00138536:
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar2,"==",pcVar3);
LAB_0013853d:
  exit(1);
}

Assistant:

TEST(GetCommandLineFlagInfoOrDieTest, FlagExistsAndWasAssigned) {
  FLAGS_test_int32 = 400;
  CommandLineFlagInfo info;
  info = GetCommandLineFlagInfoOrDie("test_int32");
  EXPECT_EQ("test_int32", info.name);
  EXPECT_EQ("int32", info.type);
  EXPECT_EQ("", info.description);
  EXPECT_EQ("400", info.current_value);
  EXPECT_EQ("-1", info.default_value);
  EXPECT_FALSE(info.is_default);
  EXPECT_EQ(&FLAGS_test_int32, info.flag_ptr);
  FLAGS_test_bool = true;
  info = GetCommandLineFlagInfoOrDie("test_bool");
  EXPECT_EQ("test_bool", info.name);
  EXPECT_EQ("bool", info.type);
  EXPECT_EQ("tests bool-ness", info.description);
  EXPECT_EQ("true", info.current_value);
  EXPECT_EQ("false", info.default_value);
  EXPECT_FALSE(info.is_default);
  EXPECT_FALSE(info.has_validator_fn);
  EXPECT_EQ(&FLAGS_test_bool, info.flag_ptr);
}